

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spdlog_impl.h
# Opt level: O0

shared_ptr<spdlog::logger> __thiscall
spdlog::
create<spdlog::sinks::daily_file_sink<std::mutex,spdlog::sinks::dateonly_daily_file_name_calculator>,std::__cxx11::string,int,int>
          (spdlog *this,string *logger_name,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,int args_1,
          int args_2)

{
  registry_t<std::mutex> *logger_name_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<spdlog::logger> sVar1;
  sinks_init_list sinks;
  element_type *local_c0;
  element_type local_68;
  element_type local_58;
  undefined1 local_48 [24];
  sink_ptr sink;
  int args_local_2;
  int args_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  string *logger_name_local;
  
  sink.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
       args_2;
  sink.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       args_1;
  std::
  make_shared<spdlog::sinks::daily_file_sink<std::mutex,spdlog::sinks::dateonly_daily_file_name_calculator>,std::__cxx11::string&,int&,int&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
             (int *)args,
             (int *)((long)&sink.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi + 4));
  std::shared_ptr<spdlog::sinks::sink>::
  shared_ptr<spdlog::sinks::daily_file_sink<std::mutex,spdlog::sinks::dateonly_daily_file_name_calculator>,void>
            ((shared_ptr<spdlog::sinks::sink> *)(local_48 + 0x10),
             (shared_ptr<spdlog::sinks::daily_file_sink<std::mutex,_spdlog::sinks::dateonly_daily_file_name_calculator>_>
              *)local_48);
  std::
  shared_ptr<spdlog::sinks::daily_file_sink<std::mutex,_spdlog::sinks::dateonly_daily_file_name_calculator>_>
  ::~shared_ptr((shared_ptr<spdlog::sinks::daily_file_sink<std::mutex,_spdlog::sinks::dateonly_daily_file_name_calculator>_>
                 *)local_48);
  logger_name_00 = details::registry_t<std::mutex>::instance();
  std::shared_ptr<spdlog::sinks::sink>::shared_ptr
            ((shared_ptr<spdlog::sinks::sink> *)&local_68,
             (shared_ptr<spdlog::sinks::sink> *)(local_48 + 0x10));
  local_58._level.super___atomic_base<int>._M_i = (__atomic_base<int>)0x1;
  local_58._12_4_ = 0;
  sinks._M_len = (size_type)&local_68;
  sinks._M_array = (iterator)logger_name;
  local_58._vptr_sink = (_func_int **)&local_68;
  details::registry_t<std::mutex>::create
            ((registry_t<std::mutex> *)this,(string *)logger_name_00,sinks);
  local_c0 = &local_58;
  do {
    local_c0 = local_c0 + -1;
    std::shared_ptr<spdlog::sinks::sink>::~shared_ptr((shared_ptr<spdlog::sinks::sink> *)local_c0);
  } while (local_c0 != &local_68);
  std::shared_ptr<spdlog::sinks::sink>::~shared_ptr
            ((shared_ptr<spdlog::sinks::sink> *)(local_48 + 0x10));
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<spdlog::logger>)
         sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<spdlog::logger> spdlog::create(const std::string &logger_name, Args... args)
{
    sink_ptr sink = std::make_shared<Sink>(args...);
    return details::registry::instance().create(logger_name, {sink});
}